

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O1

size_t __thiscall
pstore::file::file_handle::read_buffer(file_handle *this,not_null<void_*> buffer,size_t nbytes)

{
  pointer pcVar1;
  size_t sVar2;
  int *piVar3;
  int err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((long)nbytes < 0) {
    raise<std::errc,char[12]>(invalid_argument,(char (*) [12])"read_buffer");
  }
  if (this->file_ != -1) {
    sVar2 = read(this->file_,buffer.ptr_,nbytes);
    if (-1 < (long)sVar2) {
      return sVar2;
    }
    err = 0x16;
    if (sVar2 == 0xffffffffffffffff) {
      piVar3 = __errno_location();
      err = *piVar3;
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    pcVar1 = (this->path_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (this->path_)._M_string_length);
    (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
              (err,"read failed",&local_38);
  }
  raise<std::errc>(bad_file_descriptor);
}

Assistant:

std::size_t file_handle::read_buffer (gsl::not_null<void *> const buffer,
                                              std::size_t const nbytes) {
            if (nbytes > unsigned_cast (std::numeric_limits<ssize_t>::max ())) {
                raise (std::errc::invalid_argument, "read_buffer");
            }
            this->ensure_open ();

            ssize_t const r = ::read (file_, buffer.get (), nbytes);
            if (r < 0) {
                int const err = (r == -1) ? errno : EINVAL;
                raise_file_error (err, "read failed", this->path ());
            }
            return static_cast<std::size_t> (r);
        }